

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

bool __thiscall
Ptex::v2_2::PtexUtils::anon_unknown_1::CompareRfaceIds::operator()
          (CompareRfaceIds *this,uint32_t faceid1,uint32_t faceid2)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  FaceInfo *this_00;
  FaceInfo *this_01;
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  int min2;
  int min1;
  FaceInfo *f2;
  FaceInfo *f1;
  
  this_01 = (FaceInfo *)(*in_RDI + (ulong)in_ESI * 0x14);
  this_00 = (FaceInfo *)(*in_RDI + (ulong)in_EDX * 0x14);
  bVar1 = FaceInfo::isConstant(this_01);
  if (bVar1) {
    cVar2 = '\x01';
  }
  else {
    cVar2 = min<signed_char>((this_01->res).ulog2,(this_01->res).vlog2);
  }
  bVar1 = FaceInfo::isConstant(this_00);
  if (bVar1) {
    cVar3 = '\x01';
  }
  else {
    cVar3 = min<signed_char>((this_00->res).ulog2,(this_00->res).vlog2);
  }
  return cVar3 < cVar2;
}

Assistant:

bool operator() (uint32_t faceid1, uint32_t faceid2)
        {
            const Ptex::FaceInfo& f1 = faces[faceid1];
            const Ptex::FaceInfo& f2 = faces[faceid2];
            int min1 = f1.isConstant() ? 1 : PtexUtils::min(f1.res.ulog2, f1.res.vlog2);
            int min2 = f2.isConstant() ? 1 : PtexUtils::min(f2.res.ulog2, f2.res.vlog2);
            return min1 > min2;
        }